

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O3

void BandCopy(DlsMat A,DlsMat B,sunindextype copymu,sunindextype copyml)

{
  long lVar1;
  realtype **pprVar2;
  long lVar3;
  realtype **pprVar4;
  long lVar5;
  realtype *prVar6;
  realtype *prVar7;
  long lVar8;
  long lVar9;
  
  lVar1 = A->M;
  if (0 < lVar1) {
    pprVar2 = A->cols;
    lVar3 = B->s_mu;
    pprVar4 = B->cols;
    lVar5 = A->s_mu;
    lVar8 = 0;
    do {
      if (-1 < copyml + copymu) {
        prVar6 = pprVar2[lVar8];
        prVar7 = pprVar4[lVar8];
        lVar9 = -copymu;
        do {
          prVar7[lVar3 + lVar9] = prVar6[lVar5 + lVar9];
          lVar9 = lVar9 + 1;
        } while (copyml + 1 != lVar9);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar1);
  }
  return;
}

Assistant:

void BandCopy(DlsMat A, DlsMat B, sunindextype copymu, sunindextype copyml)
{
  bandCopy(A->cols, B->cols, A->M, A->s_mu, B->s_mu, copymu, copyml);
}